

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall Memory::HeapInfo::ScanNewImplicitRoots(HeapInfo *this)

{
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar1;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *pSVar2;
  SmallLeafHeapBlock *this_00;
  SmallNormalHeapBlock *this_01;
  SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *this_02;
  SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *this_03;
  SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this_04;
  MediumLeafHeapBlock *this_05;
  MediumNormalHeapBlock *this_06;
  SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *this_07;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *this_08;
  SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *this_09;
  long lVar3;
  
  lVar3 = 0x78;
  do {
    HeapBucketGroup<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              ((HeapBucketGroup<SmallAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar3),this->recycler);
    lVar3 = lVar3 + 0x380;
  } while (lVar3 != 0xa878);
  lVar3 = 0xa878;
  do {
    HeapBucketGroup<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              ((HeapBucketGroup<MediumAllocationBlockAttributes> *)
               ((long)&((HeapInfo *)(&this->smallBlockPageHeapBucketFilter + -0xc))->recycler +
               lVar3),this->recycler);
    lVar3 = lVar3 + 0x380;
  } while (lVar3 != 0x10df8);
  LargeHeapBucket::ScanNewImplicitRoots(&this->largeObjectBucket,this->recycler);
  this_00 = this->newLeafHeapBlockList;
  while (this_00 != (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallLeafHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_00,this->recycler);
    pSVar1 = (this_00->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_00 = (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_00 = HeapBlock::AsLeafBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
    }
  }
  this_01 = this->newNormalHeapBlockList;
  while (this_01 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_01,this->recycler);
    pSVar1 = (this_01->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_01 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_01 = HeapBlock::AsNormalBlock<SmallAllocationBlockAttributes>(&pSVar1->super_HeapBlock);
    }
  }
  this_02 = &this->newNormalWithBarrierHeapBlockList->
             super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
  while (this_02 != (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_02,this->recycler);
    pSVar1 = (this_02->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_02 = (SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_02 = &HeapBlock::AsNormalWriteBarrierBlock<SmallAllocationBlockAttributes>
                           (&pSVar1->super_HeapBlock)->
                 super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>;
    }
  }
  this_03 = this->newFinalizableWithBarrierHeapBlockList;
  while (this_03 != (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              ((SmallNormalHeapBlockT<SmallAllocationBlockAttributes> *)this_03,this->recycler);
    pSVar1 = (this_03->super_SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>.
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_03 = (SmallFinalizableWithBarrierHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_03 = HeapBlock::AsFinalizableWriteBarrierBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
    }
  }
  this_04 = this->newFinalizableHeapBlockList;
  while (this_04 != (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<SmallAllocationBlockAttributes>::ScanNewImplicitRoots
              (&this_04->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>,this->recycler)
    ;
    pSVar1 = (this_04->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
             super_SmallHeapBlockT<SmallAllocationBlockAttributes>.next;
    if (pSVar1 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      this_04 = (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *)0x0;
    }
    else {
      this_04 = HeapBlock::AsFinalizableBlock<SmallAllocationBlockAttributes>
                          (&pSVar1->super_HeapBlock);
    }
  }
  this_05 = this->newMediumLeafHeapBlockList;
  while (this_05 != (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_05,this->recycler);
    pSVar2 = (this_05->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_05 = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_05 = HeapBlock::AsLeafBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
    }
  }
  this_06 = this->newMediumNormalHeapBlockList;
  while (this_06 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_06,this->recycler);
    pSVar2 = (this_06->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_06 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_06 = HeapBlock::AsNormalBlock<MediumAllocationBlockAttributes>(&pSVar2->super_HeapBlock);
    }
  }
  this_07 = &this->newMediumNormalWithBarrierHeapBlockList->
             super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
  while (this_07 != (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (this_07,this->recycler);
    pSVar2 = (this_07->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_07 = (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_07 = &HeapBlock::AsNormalWriteBarrierBlock<MediumAllocationBlockAttributes>
                           (&pSVar2->super_HeapBlock)->
                 super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>;
    }
  }
  this_08 = this->newMediumFinalizableWithBarrierHeapBlockList;
  while (this_08 != (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              ((SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)this_08,this->recycler);
    pSVar2 = (this_08->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_08 = (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_08 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
    }
  }
  this_09 = this->newMediumFinalizableHeapBlockList;
  while (this_09 != (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    SmallNormalHeapBlockT<MediumAllocationBlockAttributes>::ScanNewImplicitRoots
              (&this_09->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>,this->recycler
              );
    pSVar2 = (this_09->super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>).
             super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (pSVar2 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      this_09 = (SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      this_09 = HeapBlock::AsFinalizableBlock<MediumAllocationBlockAttributes>
                          (&pSVar2->super_HeapBlock);
    }
  }
  return;
}

Assistant:

void
HeapInfo::ScanNewImplicitRoots()
{
    for (uint i = 0; i < HeapConstants::BucketCount; i++)
    {
        heapBuckets[i].ScanNewImplicitRoots(recycler);
    }
#ifdef BUCKETIZE_MEDIUM_ALLOCATIONS
    for (uint i = 0; i < HeapConstants::MediumBucketCount; i++)
    {
        mediumHeapBuckets[i].ScanNewImplicitRoots(recycler);
    }
#endif

    largeObjectBucket.ScanNewImplicitRoots(recycler);

#if ENABLE_CONCURRENT_GC

    // NOTE: need to do newLeafHeapBlockList to find new memory
    HeapBlockList::ForEach(newLeafHeapBlockList, [this](SmallLeafHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newNormalHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newNormalWithBarrierHeapBlockList, [this](SmallNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newFinalizableWithBarrierHeapBlockList, [this](SmallFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newFinalizableHeapBlockList, [this](SmallNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    // NOTE: need to do newLeafHeapBlockList to find new memory
    HeapBlockList::ForEach(newMediumLeafHeapBlockList, [this](MediumLeafHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumNormalHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#ifdef RECYCLER_WRITE_BARRIER
    HeapBlockList::ForEach(newMediumNormalWithBarrierHeapBlockList, [this](MediumNormalWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

    HeapBlockList::ForEach(newMediumFinalizableWithBarrierHeapBlockList, [this](MediumFinalizableWithBarrierHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });
#endif

    HeapBlockList::ForEach(newMediumFinalizableHeapBlockList, [this](MediumNormalHeapBlock * heapBlock)
    {
        heapBlock->ScanNewImplicitRoots(recycler);
    });

#endif
}